

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# netbase.h
# Opt level: O3

void __thiscall Proxy::Proxy(Proxy *this,CService *_proxy,bool _randomize_credentials)

{
  long lVar1;
  uint32_t uVar2;
  long in_FS_OFFSET;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  prevector<16U,_unsigned_char,_unsigned_int,_int>::prevector
            ((prevector<16U,_unsigned_char,_unsigned_int,_int> *)this,
             (prevector<16U,_unsigned_char,_unsigned_int,_int> *)_proxy);
  uVar2 = (_proxy->super_CNetAddr).m_scope_id;
  (this->proxy).super_CNetAddr.m_net = (_proxy->super_CNetAddr).m_net;
  (this->proxy).super_CNetAddr.m_scope_id = uVar2;
  (this->proxy).port = _proxy->port;
  (this->m_unix_socket_path)._M_dataplus._M_p = (pointer)&(this->m_unix_socket_path).field_2;
  (this->m_unix_socket_path)._M_string_length = 0;
  (this->m_unix_socket_path).field_2._M_local_buf[0] = '\0';
  this->m_is_unix_socket = false;
  this->m_randomize_credentials = _randomize_credentials;
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

explicit Proxy(const CService& _proxy, bool _randomize_credentials = false) : proxy(_proxy), m_is_unix_socket(false), m_randomize_credentials(_randomize_credentials) {}